

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall
GameEngine::calculateCell
          (GameEngine *this,size_t posX,size_t posY,int32_t carnivore,int32_t herbivore)

{
  bool bVar1;
  int32_t iVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_38 [8];
  shared_ptr<CellType> cell;
  int32_t herbivore_local;
  int32_t carnivore_local;
  size_t posY_local;
  size_t posX_local;
  GameEngine *this_local;
  
  cell.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = herbivore;
  cell.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = carnivore;
  getCell((GameEngine *)local_38,(size_t)this,posX);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    peVar4 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    iVar2 = CellType::getCarnivoreCount(peVar4);
    CellType::setCarnivoreCount
              (peVar3,iVar2 + cell.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._4_4_);
    peVar3 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    peVar4 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_38);
    iVar2 = CellType::getHerbivoreCount(peVar4);
    CellType::setHerbivoreCount
              (peVar3,iVar2 + (int32_t)cell.super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
  }
  std::shared_ptr<CellType>::~shared_ptr((shared_ptr<CellType> *)local_38);
  return;
}

Assistant:

void GameEngine::calculateCell(size_t posX, size_t posY, int32_t carnivore, int32_t herbivore) {
  auto cell = getCell(posX, posY);

  if (cell) {
    cell->setCarnivoreCount(cell->getCarnivoreCount() + carnivore);
    cell->setHerbivoreCount(cell->getHerbivoreCount() + herbivore);
  }
}